

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::checkArguments
          (AssocArrayDeleteMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,1)
  ;
  if ((!bVar2) || (bVar2 = SystemSubroutine::registerLValue(*args->_M_ptr,context), !bVar2)) {
    return pCVar1->errorType;
  }
  if ((1 < (args->_M_extent)._M_extent_value) &&
     ((pTVar3 = Type::getAssociativeIndexType(((*args->_M_ptr)->type).ptr), pTVar3 == (Type *)0x0 &&
      (bVar2 = Type::isIntegral((args->_M_ptr[1]->type).ptr), !bVar2)))) {
    pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
    return pTVar3;
  }
  return pCVar1->voidType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 1))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        if (args.size() > 1) {
            auto& type = *args[0]->type;
            auto indexType = type.getAssociativeIndexType();
            if (!indexType && !args[1]->type->isIntegral())
                return badArg(context, *args[1]);
        }

        return comp.getVoidType();
    }